

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,Assert *ast)

{
  long in_RSI;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 0x80);
  if (*(long *)(in_RSI + 0xa0) != 0) {
    (**(code **)(*in_RDI + 8))(in_RDI,in_RSI + 0x88);
    (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 0xa0);
  }
  (**(code **)(*in_RDI + 8))(in_RDI,in_RSI + 0xa8);
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI + 0xc0);
  return;
}

Assistant:

void CompilerPass::visit(Assert *ast)
{
    expr(ast->cond);
    if (ast->message != nullptr) {
        fodder(ast->colonFodder);
        expr(ast->message);
    }
    fodder(ast->semicolonFodder);
    expr(ast->rest);
}